

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O2

int LLGetBits(uint8_t *data,size_t data_size,size_t nb,int *val,uint64_t *bit_pos)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  *val = 0;
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (nb <= uVar2) {
      return 1;
    }
    uVar1 = *bit_pos;
    *bit_pos = uVar1 + 1;
    if (data_size <= uVar1 >> 3) break;
    uVar3 = uVar3 | (uint)((data[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0) << ((byte)uVar2 & 0x1f)
    ;
    *val = uVar3;
    uVar2 = uVar2 + 1;
  }
  return 0;
}

Assistant:

static int LLGetBits(const uint8_t* const data, size_t data_size, size_t nb,
                     int* val, uint64_t* const bit_pos) {
  uint32_t i = 0;
  *val = 0;
  while (i < nb) {
    const uint64_t p = (*bit_pos)++;
    if ((p >> 3) >= data_size) {
      return 0;
    } else {
      const int bit = !!(data[p >> 3] & (1 << ((p & 7))));
      *val = *val | (bit << i);
      ++i;
    }
  }
  return 1;
}